

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

void GUIRender(HGUI handle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  mu_Color mVar11;
  uchar *puVar12;
  mu_Vec2 mVar13;
  mu_Rect mVar14;
  mu_Rect src;
  mu_Rect src_00;
  mu_Command *cmd;
  double y;
  double x;
  mu_Command *local_48;
  double local_40;
  double local_38;
  undefined8 uVar9;
  undefined8 uVar10;
  
  glfwGetCursorPos(*(GLFWwindow **)((long)handle + 0x18),&local_38,&local_40);
  mu_input_mousemove(*(mu_Context **)((long)handle + 0x10),(int)local_38,(int)local_40);
  *(ulong *)((long)handle + 0x1a0ca0) = CONCAT44((int)local_40,(int)local_38);
  local_48 = (mu_Command *)0x0;
  iVar7 = mu_next_command(*(mu_Context **)((long)handle + 0x10),&local_48);
  do {
    if (iVar7 == 0) {
      Render((GUI *)handle);
      return;
    }
    switch(local_48->type) {
    case 2:
      uVar1 = ((mu_Rect *)((long)local_48 + 8))->x;
      uVar3 = ((mu_Rect *)((long)local_48 + 8))->y;
      mVar13 = (local_48->text).pos;
      Render((GUI *)handle);
      (*glad_glEnable)(0xc11);
      iVar7 = mVar13.y;
      (*glad_glScissor)(uVar1,*(int *)((long)handle + 0x1a0c9c) - (uVar3 + iVar7),mVar13.x,iVar7);
      break;
    case 3:
      mVar14 = (local_48->clip).rect;
      mVar11 = (local_48->rect).color;
      uVar9 = *(undefined8 *)((long)handle + 0x1a0070);
      uVar10 = *(undefined8 *)((long)handle + 0x1a0078);
      goto LAB_00117a50;
    case 4:
      bVar5 = (local_48->icon).color.r;
      if (bVar5 != 0) {
        mVar11 = (local_48->rect).color;
        mVar13 = (local_48->text).pos;
        puVar12 = &(local_48->icon).color.g;
        do {
          bVar6 = bVar5 + 6;
          if (0x7e < bVar5) {
            bVar6 = 0x85;
          }
          uVar10 = *(undefined8 *)((long)handle + (ulong)bVar6 * 0x10 + 0x1a0028);
          mVar14.w = (int)uVar10;
          mVar14.h = (int)((ulong)uVar10 >> 0x20);
          mVar14.x = mVar13.x;
          mVar14.y = mVar13.y;
          src.w = (int)uVar10;
          src.h = (int)((ulong)uVar10 >> 0x20);
          src._0_8_ = *(undefined8 *)((long)handle + (ulong)bVar6 * 0x10 + 0x1a0020);
          PushQuad((GUI *)handle,mVar14,src,mVar11);
          mVar13 = (mu_Vec2)((ulong)mVar13 & 0xffffffff00000000 |
                            (ulong)(uint)(mVar13.x + (int)uVar10));
          bVar5 = *puVar12;
          puVar12 = puVar12 + 1;
        } while (bVar5 != 0);
      }
      break;
    case 5:
      uVar2 = ((mu_Rect *)((long)local_48 + 8))->x;
      uVar4 = ((mu_Rect *)((long)local_48 + 8))->y;
      mVar11 = (local_48->icon).color;
      lVar8 = (long)(local_48->icon).id * 0x10;
      uVar10 = *(undefined8 *)((long)handle + lVar8 + 0x1a0028);
      uVar9 = *(undefined8 *)((long)handle + lVar8 + 0x1a0020);
      iVar7 = (int)((ulong)uVar10 >> 0x20);
      mVar14 = mu_rect(((local_48->text).pos.x - (int)uVar10) / 2 + uVar2,
                       ((local_48->text).pos.y - iVar7) / 2 + uVar4,(int)uVar10,iVar7);
LAB_00117a50:
      src_00.w = (int)uVar10;
      src_00.h = (int)((ulong)uVar10 >> 0x20);
      src_00.x = (int)uVar9;
      src_00.y = (int)((ulong)uVar9 >> 0x20);
      PushQuad((GUI *)handle,mVar14,src_00,mVar11);
    }
    iVar7 = mu_next_command(*(mu_Context **)((long)handle + 0x10),&local_48);
  } while( true );
}

Assistant:

void GUIRender(HGUI handle) {
    GUI* gui = (GUI*)handle;
    GLFWwindow* window = gui->Window;

    double x, y;
    glfwGetCursorPos(window, &x, &y);
    mu_input_mousemove(gui->Ctx, x, y);
    gui->CursorX = x;
    gui->CursorY = y;

    mu_Command *cmd = NULL;
    while (mu_next_command(gui->Ctx, &cmd)) {
        switch (cmd->type) {
            case MU_COMMAND_TEXT: DrawText(gui, cmd->text.str, cmd->text.pos, cmd->text.color); break;
            case MU_COMMAND_RECT: DrawRect(gui, cmd->rect.rect, cmd->rect.color); break;
            case MU_COMMAND_ICON: DrawIcon(gui, cmd->icon.id, cmd->icon.rect, cmd->icon.color); break;
            case MU_COMMAND_CLIP: ClipRect(gui, cmd->clip.rect); break;
        }
    }

    Render(gui);
}